

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::MergingIterator::Prev(MergingIterator *this)

{
  IteratorWrapper *this_00;
  IteratorWrapper *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  int i;
  long lVar4;
  Slice local_40;
  
  iVar2 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((char)iVar2 != '\0') {
    if (this->direction_ != kReverse) {
      lVar3 = 0;
      for (lVar4 = 0; lVar4 < this->n_; lVar4 = lVar4 + 1) {
        pIVar1 = this->children_;
        this_00 = (IteratorWrapper *)((long)&pIVar1->iter_ + lVar3);
        if (this_00 != this->current_) {
          iVar2 = (*(this->super_Iterator)._vptr_Iterator[8])(this);
          local_40.data_ = (char *)CONCAT44(extraout_var,iVar2);
          IteratorWrapper::Seek(this_00,&local_40);
          if ((&pIVar1->valid_)[lVar3] == true) {
            IteratorWrapper::Prev(this_00);
          }
          else {
            IteratorWrapper::SeekToLast(this_00);
          }
        }
        lVar3 = lVar3 + 0x20;
      }
      this->direction_ = kReverse;
    }
    IteratorWrapper::Prev(this->current_);
    FindLargest(this);
    return;
  }
  __assert_fail("Valid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/merger.cc"
                ,0x52,"virtual void leveldb::(anonymous namespace)::MergingIterator::Prev()");
}

Assistant:

void Prev() override {
    assert(Valid());

    // Ensure that all children are positioned before key().
    // If we are moving in the reverse direction, it is already
    // true for all of the non-current_ children since current_ is
    // the largest child and key() == current_->key().  Otherwise,
    // we explicitly position the non-current_ children.
    if (direction_ != kReverse) {
      for (int i = 0; i < n_; i++) {
        IteratorWrapper* child = &children_[i];
        if (child != current_) {
          child->Seek(key());
          if (child->Valid()) {
            // Child is at first entry >= key().  Step back one to be < key()
            child->Prev();
          } else {
            // Child has no entries >= key().  Position at last entry.
            child->SeekToLast();
          }
        }
      }
      direction_ = kReverse;
    }

    current_->Prev();
    FindLargest();
  }